

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void find_suite::upper_bound(void)

{
  initializer_list<int> __l;
  initializer_list<int> input;
  iterator second_begin;
  iterator second_end;
  iterator iVar1;
  iterator __last;
  basic_iterator<int> first_begin;
  allocator<int> local_bd;
  int local_bc;
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> expect;
  basic_iterator<int> upper;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  upper.current._0_4_ = 0xb;
  upper.current._4_4_ = 0x16;
  input._M_len = 4;
  input._M_array = (iterator)&upper.current;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  __last = vista::circular_view<int,_18446744073709551615UL>::end
                     ((circular_view<int,_18446744073709551615UL> *)local_38);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x21;
  first_begin = std::
                upper_bound<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int>
                          (iVar1,__last,
                           (int *)((long)&expect.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_bc = 0x2c;
  local_b8 = &local_bc;
  local_b0 = 1;
  std::allocator<int>::allocator(&local_bd);
  __l._M_len = local_b0;
  __l._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a8,__l,&local_bd);
  std::allocator<int>::~allocator(&local_bd);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_a8);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_a8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x17c,"void find_suite::upper_bound()",first_begin,iVar1,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a8);
  return;
}

Assistant:

void upper_bound()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    auto upper = std::upper_bound(span.begin(), span.end(), 33);
    {
        std::vector<int> expect = { 44 };
        BOOST_TEST_ALL_EQ(upper, span.end(),
                          expect.begin(), expect.end());
    }
}